

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O0

REF_STATUS ref_gather_plt_char_int(char *char_string,REF_INT max,REF_INT *n,REF_INT *int_string)

{
  int local_34;
  REF_INT i;
  REF_INT *int_string_local;
  REF_INT *n_local;
  REF_INT max_local;
  char *char_string_local;
  
  *n = 0;
  local_34 = 0;
  while( true ) {
    if (max <= local_34) {
      return 7;
    }
    int_string[local_34] = (int)char_string[local_34];
    *n = *n + 1;
    if (int_string[local_34] == 0) break;
    local_34 = local_34 + 1;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_gather_plt_char_int(const char *char_string, REF_INT max,
                                           REF_INT *n, REF_INT *int_string) {
  REF_INT i;
  *n = 0;
  for (i = 0; i < max; i++) {
    int_string[i] = (REF_INT)char_string[i];
    (*n)++;
    if (0 == int_string[i]) return REF_SUCCESS;
  }
  return REF_INCREASE_LIMIT;
}